

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

int CMcontrol_list_wait(CMControlList cl)

{
  CMPollFunc p_Var1;
  pthread_t pVar2;
  pthread_t pVar3;
  
  pVar3 = cl->server_thread;
  if (pVar3 != 0) {
    pVar2 = pthread_self();
    if (pVar3 != pVar2) {
      CMcontrol_list_wait_cold_1();
    }
  }
  pVar3 = pthread_self();
  cl->server_thread = pVar3;
  p_Var1 = (cl->network_blocking_function).func;
  if (p_Var1 != (CMPollFunc)0x0) {
    (*p_Var1)((CManager)&CMstatic_trans_svcs,(cl->network_blocking_function).client_data);
  }
  CMcontrol_list_poll(cl);
  return 1;
}

Assistant:

extern
int
CMcontrol_list_wait(CMControlList cl)
{
    /* associated CM should be locked */
    if ((cl->server_thread != 0) &&
	(cl->server_thread != thr_thread_self())) {
	/* What?  We're polling, but we're not the server thread? */
	fprintf(stderr, "Warning:  Multiple threads calling CMnetwork_wait\n");
	fprintf(stderr, "          This situation may result in unexpected I/O blocking.\n");
	fprintf(stderr, "          Server thread set to %zx.\n", (size_t) thr_thread_self());
    }
    cl->server_thread = thr_thread_self();
    if (cl->network_blocking_function.func != NULL) {
	cl->network_blocking_function.func((void*)&CMstatic_trans_svcs,
					   cl->network_blocking_function.client_data);
    }
    CMcontrol_list_poll(cl);
    return 1;
}